

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database_query_tests.cpp
# Opt level: O0

void __thiscall
QueryTests_InsertInto_canDetermineSpecificationForInsertInto_Test::
~QueryTests_InsertInto_canDetermineSpecificationForInsertInto_Test
          (QueryTests_InsertInto_canDetermineSpecificationForInsertInto_Test *this)

{
  QueryTests_InsertInto_canDetermineSpecificationForInsertInto_Test *this_local;
  
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

TEST(QueryTests_InsertInto,canDetermineSpecificationForInsertInto)
{
  database::Query query_insert_into = "insert into company.employee values(employee_id:1,employee_name:chandan,employee_status:fulltime)";
  ASSERT_TRUE(query_insert_into.transactionMetaType() == database::dml);
  ASSERT_TRUE(query_insert_into.databaseName() == "company");
  ASSERT_TRUE(query_insert_into.containerName() == "employee");
  std::map<std::string,std::string> values = {
    {"employee_id","1"},
    {"employee_name","chandan"},
    {"employee_status","fulltime"}
  };
  ASSERT_TRUE(query_insert_into.values() == values);
}